

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_bytedata.cpp
# Opt level: O2

void __thiscall cfd::core::ByteData256::ByteData256(ByteData256 *this,string *hex)

{
  CfdException *this_00;
  unsigned_long local_60;
  vector<unsigned_char,_std::allocator<unsigned_char>_> vector;
  string local_40;
  
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&this->data_,0x20,(allocator_type *)&local_40);
  StringUtil::StringToByte(&vector,(string *)hex);
  local_60 = (long)vector.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)vector.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start;
  if (local_60 == 0x20) {
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=(&this->data_,&vector);
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&vector.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
    return;
  }
  local_40._M_dataplus._M_p = "cfdcore_bytedata.cpp";
  local_40._M_string_length._0_4_ = 0x111;
  local_40.field_2._M_allocated_capacity = (long)"Hash160ByteData256" + 7;
  logger::warn<unsigned_long>
            ((CfdSourceLocation *)&local_40,"ByteData256 size unmatch. size={}.",&local_60);
  this_00 = (CfdException *)__cxa_allocate_exception(0x30);
  ::std::__cxx11::string::string
            ((string *)&local_40,"ByteData256 size unmatch.",(allocator *)&local_60);
  CfdException::CfdException(this_00,kCfdIllegalArgumentError,&local_40);
  __cxa_throw(this_00,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

ByteData256::ByteData256(const std::string& hex)
    : data_(std::vector<uint8_t>(kByteData256Length)) {
  std::vector<uint8_t> vector = StringUtil::StringToByte(hex);
  if (vector.size() != kByteData256Length) {
    warn(CFD_LOG_SOURCE, "ByteData256 size unmatch. size={}.", vector.size());
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "ByteData256 size unmatch.");
  }
  data_ = vector;
}